

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::LookupBucketFor<llvm::StringRef>
          (DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
           *this,StringRef *Val,DenseSetPair<llvm::StringRef> **FoundBucket)

{
  StringRef LHS;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  DenseSetPair<llvm::StringRef> *pDVar5;
  StringRef *pSVar6;
  StringRef RHS;
  StringRef RHS_00;
  DenseSetPair<llvm::StringRef> *local_128;
  DenseSetPair<llvm::StringRef> *ThisBucket;
  uint ProbeAmt;
  uint BucketNo;
  StringRef TombstoneKey;
  StringRef EmptyKey;
  DenseSetPair<llvm::StringRef> *FoundTombstone;
  uint NumBuckets;
  DenseSetPair<llvm::StringRef> *BucketsPtr;
  DenseSetPair<llvm::StringRef> **FoundBucket_local;
  StringRef *Val_local;
  DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
  *this_local;
  
  pDVar5 = getBuckets(this);
  uVar3 = getNumBuckets(this);
  if (uVar3 == 0) {
    *FoundBucket = (DenseSetPair<llvm::StringRef> *)0x0;
    this_local._7_1_ = false;
  }
  else {
    EmptyKey.Length = 0;
    RHS = getEmptyKey();
    RHS_00 = getTombstoneKey();
    bVar1 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,RHS);
    bVar2 = false;
    if (!bVar1) {
      bVar1 = DenseMapInfo<llvm::StringRef>::isEqual(*Val,RHS_00);
      bVar2 = false;
      if (!bVar1) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      __assert_fail("!KeyInfoT::isEqual(Val, EmptyKey) && !KeyInfoT::isEqual(Val, TombstoneKey) && \"Empty/Tombstone value shouldn\'t be inserted into map!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                    ,0x24d,
                    "bool llvm::DenseMapBase<llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::LookupBucketFor(const LookupKeyT &, const BucketT *&) const [DerivedT = llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>, LookupKeyT = llvm::StringRef]"
                   );
    }
    uVar4 = getHashValue(Val);
    ThisBucket._4_4_ = uVar4 & uVar3 - 1;
    ThisBucket._0_4_ = 1;
    while( true ) {
      local_128 = pDVar5 + ThisBucket._4_4_;
      LHS = *Val;
      pSVar6 = detail::DenseSetPair<llvm::StringRef>::getFirst(local_128);
      bVar2 = DenseMapInfo<llvm::StringRef>::isEqual(LHS,*pSVar6);
      if (bVar2) break;
      pSVar6 = detail::DenseSetPair<llvm::StringRef>::getFirst(local_128);
      bVar2 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar6,RHS);
      if (bVar2) {
        if (EmptyKey.Length != 0) {
          local_128 = (DenseSetPair<llvm::StringRef> *)EmptyKey.Length;
        }
        *FoundBucket = local_128;
        return false;
      }
      pSVar6 = detail::DenseSetPair<llvm::StringRef>::getFirst(local_128);
      bVar2 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar6,RHS_00);
      if ((bVar2) && (EmptyKey.Length == 0)) {
        EmptyKey.Length = (size_t)local_128;
      }
      ThisBucket._4_4_ = uVar3 - 1 & (int)ThisBucket + ThisBucket._4_4_;
      ThisBucket._0_4_ = (int)ThisBucket + 1;
    }
    *FoundBucket = local_128;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool LookupBucketFor(const LookupKeyT &Val,
                       const BucketT *&FoundBucket) const {
    const BucketT *BucketsPtr = getBuckets();
    const unsigned NumBuckets = getNumBuckets();

    if (NumBuckets == 0) {
      FoundBucket = nullptr;
      return false;
    }

    // FoundTombstone - Keep track of whether we find a tombstone while probing.
    const BucketT *FoundTombstone = nullptr;
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    assert(!KeyInfoT::isEqual(Val, EmptyKey) &&
           !KeyInfoT::isEqual(Val, TombstoneKey) &&
           "Empty/Tombstone value shouldn't be inserted into map!");

    unsigned BucketNo = getHashValue(Val) & (NumBuckets-1);
    unsigned ProbeAmt = 1;
    while (true) {
      const BucketT *ThisBucket = BucketsPtr + BucketNo;
      // Found Val's bucket?  If so, return it.
      if (LLVM_LIKELY(KeyInfoT::isEqual(Val, ThisBucket->getFirst()))) {
        FoundBucket = ThisBucket;
        return true;
      }

      // If we found an empty bucket, the key doesn't exist in the set.
      // Insert it and return the default value.
      if (LLVM_LIKELY(KeyInfoT::isEqual(ThisBucket->getFirst(), EmptyKey))) {
        // If we've already seen a tombstone while probing, fill it in instead
        // of the empty bucket we eventually probed to.
        FoundBucket = FoundTombstone ? FoundTombstone : ThisBucket;
        return false;
      }

      // If this is a tombstone, remember it.  If Val ends up not in the map, we
      // prefer to return it than something that would require more probing.
      if (KeyInfoT::isEqual(ThisBucket->getFirst(), TombstoneKey) &&
          !FoundTombstone)
        FoundTombstone = ThisBucket;  // Remember the first tombstone found.

      // Otherwise, it's a hash collision or a tombstone, continue quadratic
      // probing.
      BucketNo += ProbeAmt++;
      BucketNo &= (NumBuckets-1);
    }
  }